

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_CALLNZ(Context *ctx)

{
  char *fmt;
  size_t in_R8;
  char src1 [64];
  char src0 [64];
  char acStack_98 [64];
  char local_58 [64];
  
  make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,local_58,in_R8);
  make_METAL_srcarg_string(ctx,1,(ctx->dest_arg).writemask,acStack_98,in_R8);
  fmt = "if (%s) { %s(); }";
  if (0 < ctx->loops) {
    fmt = "if (%s) { %s(aL); }";
  }
  output_line(ctx,fmt,acStack_98,local_58);
  return;
}

Assistant:

static void emit_METAL_CALLNZ(Context *ctx)
{
    // !!! FIXME: if src1 is a constbool that's true, we can remove the
    // !!! FIXME:  if. If it's false, we can make this a no-op.
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));

    if (ctx->loops > 0)
        output_line(ctx, "if (%s) { %s(aL); }", src1, src0);
    else
        output_line(ctx, "if (%s) { %s(); }", src1, src0);
}